

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string_sprintf.c
# Opt level: O0

void archive_string_vsprintf(archive_string *as,char *fmt,__va_list_tag *ap)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  wchar_t wVar4;
  archive_string *paVar5;
  char *pcVar6;
  size_t sVar7;
  int *piVar8;
  uint *local_1a8;
  undefined8 *local_190;
  undefined8 *local_178;
  undefined8 *local_160;
  long *local_138;
  long *local_120;
  long *local_f8;
  int *local_e0;
  uintmax_t *local_c8;
  uintmax_t *local_b0;
  uintmax_t *local_98;
  undefined4 *local_80;
  char *saved_p;
  wchar_t *pw;
  char *p2;
  char *p;
  uintmax_t u;
  intmax_t s;
  char long_flag;
  __va_list_tag *ap_local;
  char *fmt_local;
  archive_string *as_local;
  
  paVar5 = archive_string_ensure(as,0x40);
  if (paVar5 == (archive_string *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  p2 = fmt;
  if (fmt == (char *)0x0) {
    *as->s = '\0';
  }
  else {
    for (; pcVar3 = p2, *p2 != '\0'; p2 = p2 + 1) {
      if (*p2 == '%') {
        pcVar6 = p2 + 1;
        s._7_1_ = '\0';
        cVar1 = *pcVar6;
        if (((cVar1 == 'j') || (cVar1 == 'l')) || (cVar1 == 'z')) {
          s._7_1_ = *pcVar6;
          pcVar6 = p2 + 2;
        }
        p2 = pcVar6;
        switch(*p2) {
        case '%':
          archive_strappend_char(as,'%');
          break;
        default:
          archive_strappend_char(as,*pcVar3);
          p2 = pcVar3;
          break;
        case 'S':
          uVar2 = ap->gp_offset;
          if (uVar2 < 0x29) {
            local_138 = (long *)((long)(int)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            local_138 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_138 + 1;
          }
          saved_p = (char *)*local_138;
          if (saved_p == (char *)0x0) {
            saved_p = "(";
          }
          sVar7 = wcslen((wchar_t *)saved_p);
          wVar4 = archive_string_append_from_wcs(as,(wchar_t *)saved_p,sVar7);
          if ((wVar4 != L'\0') && (piVar8 = __errno_location(), *piVar8 == 0xc)) {
            __archive_errx(1,"Out of memory");
          }
          break;
        case 'X':
        case 'o':
        case 'u':
        case 'x':
          if (s._7_1_ == 'j') {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_160 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_160 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_160 + 1;
            }
            p = (char *)*local_160;
          }
          else if (s._7_1_ == 'l') {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_178 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_178 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_178 + 1;
            }
            p = (char *)*local_178;
          }
          else if (s._7_1_ == 'z') {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_190 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_190 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_190 + 1;
            }
            p = (char *)*local_190;
          }
          else {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_1a8 = (uint *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_1a8 = (uint *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_1a8 + 2;
            }
            p = (char *)(ulong)*local_1a8;
          }
          if (*p2 == 'o') {
            append_uint(as,(uintmax_t)p,8);
          }
          else if (*p2 == 'u') {
            append_uint(as,(uintmax_t)p,10);
          }
          else {
            append_uint(as,(uintmax_t)p,0x10);
          }
          break;
        case 'c':
          uVar2 = ap->gp_offset;
          if (uVar2 < 0x29) {
            local_80 = (undefined4 *)((long)(int)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            local_80 = (undefined4 *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_80 + 2;
          }
          archive_strappend_char(as,(char)*local_80);
          break;
        case 'd':
          if (s._7_1_ == 'j') {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_98 = (uintmax_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_98 = (uintmax_t *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_98 + 1;
            }
            u = *local_98;
          }
          else if (s._7_1_ == 'l') {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_b0 = (uintmax_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_b0 = (uintmax_t *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_b0 + 1;
            }
            u = *local_b0;
          }
          else if (s._7_1_ == 'z') {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_c8 = (uintmax_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_c8 = (uintmax_t *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_c8 + 1;
            }
            u = *local_c8;
          }
          else {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_e0 = (int *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_e0 = (int *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_e0 + 2;
            }
            u = (uintmax_t)*local_e0;
          }
          append_int(as,u,10);
          break;
        case 's':
          if (s._7_1_ == 'l') {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_f8 = (long *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_f8 = (long *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_f8 + 1;
            }
            saved_p = (char *)*local_f8;
            if (saved_p == (char *)0x0) {
              saved_p = "(";
            }
            sVar7 = wcslen((wchar_t *)saved_p);
            wVar4 = archive_string_append_from_wcs(as,(wchar_t *)saved_p,sVar7);
            if ((wVar4 != L'\0') && (piVar8 = __errno_location(), *piVar8 == 0xc)) {
              __archive_errx(1,"Out of memory");
            }
          }
          else {
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_120 = (long *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_120 = (long *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_120 + 1;
            }
            pw = (wchar_t *)*local_120;
            if (pw == (wchar_t *)0x0) {
              pw = L"(null)";
            }
            archive_strcat(as,pw);
          }
        }
      }
      else {
        archive_strappend_char(as,*p2);
        p2 = pcVar3;
      }
    }
  }
  return;
}

Assistant:

void
archive_string_vsprintf(struct archive_string *as, const char *fmt,
    va_list ap)
{
	char long_flag;
	intmax_t s; /* Signed integer temp. */
	uintmax_t u; /* Unsigned integer temp. */
	const char *p, *p2;
	const wchar_t *pw;

	if (archive_string_ensure(as, 64) == NULL)
		__archive_errx(1, "Out of memory");

	if (fmt == NULL) {
		as->s[0] = 0;
		return;
	}

	for (p = fmt; *p != '\0'; p++) {
		const char *saved_p = p;

		if (*p != '%') {
			archive_strappend_char(as, *p);
			continue;
		}

		p++;

		long_flag = '\0';
		switch(*p) {
		case 'j':
		case 'l':
		case 'z':
			long_flag = *p;
			p++;
			break;
		}

		switch (*p) {
		case '%':
			archive_strappend_char(as, '%');
			break;
		case 'c':
			s = va_arg(ap, int);
			archive_strappend_char(as, (char)s);
			break;
		case 'd':
			switch(long_flag) {
			case 'j': s = va_arg(ap, intmax_t); break;
			case 'l': s = va_arg(ap, long); break;
			case 'z': s = va_arg(ap, ssize_t); break;
			default:  s = va_arg(ap, int); break;
			}
		        append_int(as, s, 10);
			break;
		case 's':
			switch(long_flag) {
			case 'l':
				pw = va_arg(ap, wchar_t *);
				if (pw == NULL)
					pw = L"(null)";
				if (archive_string_append_from_wcs(as, pw,
				    wcslen(pw)) != 0 && errno == ENOMEM)
					__archive_errx(1, "Out of memory");
				break;
			default:
				p2 = va_arg(ap, char *);
				if (p2 == NULL)
					p2 = "(null)";
				archive_strcat(as, p2);
				break;
			}
			break;
		case 'S':
			pw = va_arg(ap, wchar_t *);
			if (pw == NULL)
				pw = L"(null)";
			if (archive_string_append_from_wcs(as, pw,
			    wcslen(pw)) != 0 && errno == ENOMEM)
				__archive_errx(1, "Out of memory");
			break;
		case 'o': case 'u': case 'x': case 'X':
			/* Common handling for unsigned integer formats. */
			switch(long_flag) {
			case 'j': u = va_arg(ap, uintmax_t); break;
			case 'l': u = va_arg(ap, unsigned long); break;
			case 'z': u = va_arg(ap, size_t); break;
			default:  u = va_arg(ap, unsigned int); break;
			}
			/* Format it in the correct base. */
			switch (*p) {
			case 'o': append_uint(as, u, 8); break;
			case 'u': append_uint(as, u, 10); break;
			default: append_uint(as, u, 16); break;
			}
			break;
		default:
			/* Rewind and print the initial '%' literally. */
			p = saved_p;
			archive_strappend_char(as, *p);
		}
	}
}